

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O0

void __thiscall
FSChaCha20::Crypt(FSChaCha20 *this,Span<const_std::byte> input,Span<std::byte> output)

{
  Span<const_std::byte> input_00;
  Span<const_std::byte> key;
  Nonce96 nonce;
  Span<std::byte> out;
  uint32_t uVar1;
  size_t sVar2;
  size_t sVar3;
  ChaCha20 *in_RSI;
  ChaCha20 *in_RDI;
  ChaCha20 *in_R8;
  long in_FS_OFFSET;
  Span<std::byte> in_stack_00000010;
  size_t in_stack_00000028;
  byte new_key [32];
  Span<const_std::byte> *in_stack_ffffffffffffff38;
  int *__x;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar4;
  size_t in_stack_ffffffffffffff68;
  int local_28 [6];
  byte *in_stack_fffffffffffffff0;
  size_t sVar5;
  
  sVar5 = *(size_t *)(in_FS_OFFSET + 0x28);
  sVar2 = Span<const_std::byte>::size(in_stack_ffffffffffffff38);
  sVar3 = Span<std::byte>::size((Span<std::byte> *)in_stack_ffffffffffffff38);
  if (sVar2 != sVar3) {
    __assert_fail("input.size() == output.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0x160,"void FSChaCha20::Crypt(Span<const std::byte>, Span<std::byte>)");
  }
  input_00.m_size = in_stack_00000028;
  input_00.m_data = (byte *)this;
  ChaCha20::Crypt(in_R8,input_00,in_stack_00000010);
  uVar1 = in_RDI[1].m_aligned.input[1] + 1;
  in_RDI[1].m_aligned.input[1] = uVar1;
  if (uVar1 == in_RDI[1].m_aligned.input[0]) {
    __x = local_28;
    Span<std::byte>::Span<32>((Span<std::byte> *)in_stack_ffffffffffffff38,(byte (*) [32])0x10352f8)
    ;
    out.m_size = sVar5;
    out.m_data = in_stack_fffffffffffffff0;
    ChaCha20::Keystream(in_RSI,out);
    Span<const_std::byte>::Span<32>(in_stack_ffffffffffffff38,(byte (*) [32])0x103531b);
    key.m_data._4_4_ = in_stack_ffffffffffffff64;
    key.m_data._0_4_ = in_stack_ffffffffffffff60;
    key.m_size = in_stack_ffffffffffffff68;
    ChaCha20::SetKey(in_RDI,key);
    memory_cleanse(in_stack_ffffffffffffff38,0x103533e);
    uVar4 = 0;
    *(long *)(in_RDI[1].m_aligned.input + 3) = *(long *)(in_RDI[1].m_aligned.input + 3) + 1;
    std::pair<unsigned_int,_unsigned_long>::pair<int,_unsigned_long_&,_true>
              ((pair<unsigned_int,_unsigned_long> *)in_RDI,__x,(unsigned_long *)in_RDI);
    nonce._4_4_ = uVar4;
    nonce.first = in_stack_ffffffffffffff60;
    nonce.second = in_stack_ffffffffffffff68;
    ChaCha20::Seek(in_RDI,nonce,(uint32_t)((ulong)__x >> 0x20));
    in_RDI[1].m_aligned.input[1] = 0;
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) == sVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FSChaCha20::Crypt(Span<const std::byte> input, Span<std::byte> output) noexcept
{
    assert(input.size() == output.size());

    // Invoke internal stream cipher for actual encryption/decryption.
    m_chacha20.Crypt(input, output);

    // Rekey after m_rekey_interval encryptions/decryptions.
    if (++m_chunk_counter == m_rekey_interval) {
        // Get new key from the stream cipher.
        std::byte new_key[KEYLEN];
        m_chacha20.Keystream(new_key);
        // Update its key.
        m_chacha20.SetKey(new_key);
        // Wipe the key (a copy remains inside m_chacha20, where it'll be wiped on the next rekey
        // or on destruction).
        memory_cleanse(new_key, sizeof(new_key));
        // Set the nonce for the new section of output.
        m_chacha20.Seek({0, ++m_rekey_counter}, 0);
        // Reset the chunk counter.
        m_chunk_counter = 0;
    }
}